

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_random.cpp
# Opt level: O0

Reals __thiscall
Omega_h::unit_uniform_random_reals_from_globals(Omega_h *this,GOs *globals,I64 seed,I64 counter)

{
  LO size_in;
  void *extraout_RDX;
  Reals RVar1;
  Write<double> local_d8;
  undefined1 local_c8 [8];
  type functor;
  allocator local_81;
  string local_80 [32];
  undefined1 local_60 [8];
  Write<double> out;
  LO n;
  I64 counter_local;
  I64 seed_local;
  GOs *globals_local;
  ulong local_10;
  
  if (((ulong)(globals->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = ((globals->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (ulong)(globals->write_).shared_alloc_.alloc >> 3;
  }
  size_in = (LO)(local_10 >> 3);
  out.shared_alloc_.direct_ptr._4_4_ = size_in;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"",&local_81);
  Write<double>::Write((Write<double> *)local_60,size_in,(string *)local_80);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  Read<long>::Read((Read<long> *)local_c8,(Read<int> *)globals);
  functor.globals.write_.shared_alloc_.direct_ptr = (void *)seed;
  functor.seed = counter;
  Write<double>::Write((Write<double> *)&functor.counter,(Write<double> *)local_60);
  parallel_for<Omega_h::unit_uniform_random_reals_from_globals(Omega_h::Read<long>,long,long)::__0>
            (out.shared_alloc_.direct_ptr._4_4_,(type *)local_c8);
  Write<double>::Write(&local_d8,(Write<double> *)local_60);
  Read<double>::Read((Read<double> *)this,&local_d8);
  Write<double>::~Write(&local_d8);
  unit_uniform_random_reals_from_globals(Omega_h::Read<long>,long,long)::$_0::~__0((__0 *)local_c8);
  Write<double>::~Write((Write<double> *)local_60);
  RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar1.write_.shared_alloc_;
}

Assistant:

Reals unit_uniform_random_reals_from_globals(
    GOs const globals, I64 const seed, I64 const counter) {
  auto const n = globals.size();
  auto const out = Write<Real>(n);
  auto functor = OMEGA_H_LAMBDA(LO const i) {
    auto const global = globals[i];
    UnitUniformDistribution distrib(seed, global, counter);
    out[i] = distrib();
  };
  parallel_for(n, std::move(functor));
  return out;
}